

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int get_read_type(coda_cursor *cursor,coda_native_type *read_type)

{
  coda_type *pcVar1;
  coda_native_type cVar2;
  long in_FS_OFFSET;
  
  pcVar1 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar1->format) {
    pcVar1 = *(coda_type **)&pcVar1->type_class;
  }
  if ((((pcVar1->type_class != 2) && (pcVar1->type_class != 3)) ||
      (*(int *)(in_FS_OFFSET + -0x1204) == 0)) ||
     (cVar2 = coda_native_type_double, pcVar1[1].name == (char *)0x0)) {
    cVar2 = pcVar1->read_type;
  }
  *read_type = cVar2;
  return (int)pcVar1;
}

Assistant:

static int get_read_type(const coda_cursor *cursor, coda_native_type *read_type)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if ((type->type_class == coda_integer_class || type->type_class == coda_real_class) &&
        coda_option_perform_conversions && ((coda_type_number *)type)->conversion != NULL)
    {
        *read_type = coda_native_type_double;
    }
    else
    {
        *read_type = type->read_type;
    }

    return 0;
}